

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O3

int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *pNtk)

{
  int iVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  int iVar6;
  uint *__ptr;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  Abc_Obj_t *pObj;
  char *pName;
  uint uVar10;
  long lVar11;
  int Fill;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  long lVar12;
  long lVar13;
  ulong __nmemb;
  uint uVar14;
  ulong local_50;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar7 = malloc(800);
  *(void **)(__ptr + 2) = pvVar7;
  pVVar8 = pNtk->vObjs;
  if (pVVar8->nSize < 1) {
    uVar14 = 0;
LAB_00318637:
    if (pvVar7 == (void *)0x0) goto LAB_00318644;
  }
  else {
    uVar14 = 0;
    local_50 = 100;
    lVar13 = 0;
    uVar9 = extraout_RDX;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar13];
      if (plVar2 != (long *)0x0) {
        lVar12 = *plVar2;
        iVar6 = (int)plVar2[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar6 + 1,(int)uVar9);
        if (((long)iVar6 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar6)) {
LAB_0031865e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar9 = extraout_RDX_00;
        if ((*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar2 + 0xd8)) &&
           (0 < *(int *)((long)plVar2 + 0x1c))) {
          lVar12 = 0;
          do {
            pAVar3 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                      (long)*(int *)(plVar2[4] + lVar12 * 4) * 8);
            pAVar4 = pAVar3->pNtk;
            iVar6 = pAVar3->Id;
            Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,(int)uVar9);
            if (((long)iVar6 < 0) || ((pAVar4->vTravIds).nSize <= iVar6)) goto LAB_0031865e;
            uVar9 = extraout_RDX_01;
            if ((pAVar4->vTravIds).pArray[iVar6] != pAVar3->pNtk->nTravIds) {
              iVar6 = Abc_NtkCheckConstant_rec(pAVar3);
              if (iVar6 == -1) {
                uVar10 = *(uint *)&pAVar3->field_0x14;
                if ((uVar10 & 0xf) == 5) {
                  plVar5 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
                  iVar6 = Abc_NtkCheckConstant_rec
                                    (*(Abc_Obj_t **)
                                      (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                      (long)*(int *)plVar5[4] * 8));
                  if (iVar6 != -1) goto LAB_003183f6;
                  uVar10 = *(uint *)&pAVar3->field_0x14;
                }
                if ((uVar10 & 0xf) == 8) {
                  __assert_fail("!Abc_ObjIsLatch(pFanin)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                                ,0x377,"int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *)");
                }
                uVar10 = (uint)local_50;
                if (uVar14 == uVar10) {
                  if ((int)uVar10 < 0x10) {
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar7 = malloc(0x80);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
                    }
                    *(void **)(__ptr + 2) = pvVar7;
                    *__ptr = 0x10;
                    local_50 = 0x10;
                  }
                  else {
                    local_50 = (ulong)(uVar10 * 2);
                    if (*(void **)(__ptr + 2) == (void *)0x0) {
                      pvVar7 = malloc(local_50 * 8);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr + 2),local_50 * 8);
                    }
                    *(void **)(__ptr + 2) = pvVar7;
                    *__ptr = uVar10 * 2;
                  }
                }
                else {
                  pvVar7 = *(void **)(__ptr + 2);
                }
                lVar11 = (long)(int)uVar14;
                uVar14 = uVar14 + 1;
                uVar9 = (ulong)uVar14;
                __ptr[1] = uVar14;
                *(Abc_Obj_t **)((long)pvVar7 + lVar11 * 8) = pAVar3;
              }
              else {
LAB_003183f6:
                Abc_NtkSetTravId_rec(pAVar3);
                uVar9 = extraout_RDX_02;
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)plVar2 + 0x1c));
        }
      }
      lVar13 = lVar13 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar13 < pVVar8->nSize);
    pvVar7 = *(void **)(__ptr + 2);
    if (1 < (int)uVar14) {
      __nmemb = (ulong)uVar14;
      qsort(pvVar7,__nmemb,8,Abc_ObjPointerCompare);
      uVar14 = 1;
      uVar9 = 1;
      do {
        lVar13 = *(long *)((long)pvVar7 + uVar9 * 8);
        if (lVar13 != *(long *)((long)pvVar7 + uVar9 * 8 + -8)) {
          lVar12 = (long)(int)uVar14;
          uVar14 = uVar14 + 1;
          *(long *)((long)pvVar7 + lVar12 * 8) = lVar13;
        }
        uVar9 = uVar9 + 1;
      } while (__nmemb != uVar9);
      __ptr[1] = uVar14;
    }
    if ((int)uVar14 < 1) goto LAB_00318637;
    uVar9 = 0;
    do {
      pAVar3 = *(Abc_Obj_t **)((long)pvVar7 + uVar9 * 8);
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      pName = Abc_ObjName(pObj);
      Abc_ObjAssignName(pObj,pName,(char *)0x0);
      pAVar4 = pObj->pNtk;
      iVar6 = pObj->Id;
      iVar1 = pAVar4->nTravIds;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,Fill);
      if (((long)iVar6 < 0) || ((pAVar4->vTravIds).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar4->vTravIds).pArray[iVar6] = iVar1;
      Abc_ObjTransferFanout(pAVar3,pObj);
      uVar9 = uVar9 + 1;
    } while (uVar14 != uVar9);
  }
  free(pvVar7);
LAB_00318644:
  free(__ptr);
  return uVar14;
}

Assistant:

int Abc_NtkReplaceAutonomousLogic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k, Counter;
    // collect the nodes that feed into the reachable logic
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        // skip non-visited fanins
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
            continue;
        // look for non-visited fanins
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            // skip visited fanins
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            // skip constants and latches fed by constants
            if ( Abc_NtkCheckConstant_rec(pFanin) != -1 ||
                 (Abc_ObjIsBo(pFanin) && Abc_NtkCheckConstant_rec(Abc_ObjFanin0(Abc_ObjFanin0(pFanin))) != -1) )
            {
                Abc_NtkSetTravId_rec( pFanin );
                continue;
            }
            assert( !Abc_ObjIsLatch(pFanin) );
            Vec_PtrPush( vNodes, pFanin );
        }
    }
    Vec_PtrUniqify( vNodes, (int (*)(void))Abc_ObjPointerCompare );
    // replace these nodes by the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pFanin = Abc_NtkCreatePi(pNtk);
        Abc_ObjAssignName( pFanin, Abc_ObjName(pFanin), NULL );
        Abc_NodeSetTravIdCurrent( pFanin );
        Abc_ObjTransferFanout( pNode, pFanin );
    }
    Counter = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
    return Counter;
}